

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formats.h
# Opt level: O1

string * __thiscall
ktx::toString_abi_cxx11_
          (string *__return_storage_ptr__,ktx *this,khr_df_model_e colorModel,
          khr_df_model_channels_e channelType)

{
  char *__s;
  size_t sVar1;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  format_args args;
  string_view fmt;
  ulong local_28 [2];
  
  __s = (char *)dfdToStringChannelId
                          ((ulong)this & 0xffffffff,colorModel,
                           CONCAT44(in_register_00000014,colorModel),
                           CONCAT44(in_register_0000000c,channelType));
  if (__s == (char *)0x0) {
    local_28[0] = (ulong)colorModel;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_28;
    fmt.size_ = 2;
    fmt.data_ = (char *)0xa;
    ::fmt::v10::vformat_abi_cxx11_(__return_storage_ptr__,(v10 *)"(0x{:01X})",fmt,args);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,__s,__s + sVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard]] inline std::string toString(khr_df_model_e colorModel, khr_df_model_channels_e channelType) noexcept {
    const auto str = dfdToStringChannelId(colorModel, channelType);
    return str ? std::string(str) : fmt::format("(0x{:01X})", static_cast<uint32_t>(channelType));
}